

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O1

int h264_slice_data(bitstream *str,h264_slice *slice)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  h264_cabac_context *cabac;
  h264_macroblock *phVar9;
  bool bVar10;
  uint32_t mb_skip_flag;
  uint32_t end_of_slice_flag;
  uint32_t local_48;
  uint32_t local_44;
  h264_cabac_context *local_40;
  uint local_38;
  uint local_34;
  
  slice->prev_mb_addr = 0xffffffff;
  uVar1 = (slice->mbaff_frame_flag + 1) * slice->first_mb_in_slice;
  slice->curr_mb_addr = uVar1;
  if (str->dir == VS_DECODE) {
    slice->last_mb_in_slice = uVar1;
  }
  uVar1 = 0x20;
  if (slice->slice_type == 1) {
    uVar1 = 0x38;
  }
  if (slice->picparm->entropy_coding_mode_flag == 0) {
    do {
      local_48 = 0;
      if ((slice->slice_type != 2) && (slice->slice_type != 4)) {
        if (str->dir == VS_ENCODE) {
          local_48 = 0;
          phVar9 = slice->mbs;
          uVar7 = slice->curr_mb_addr;
          while( true ) {
            bVar10 = phVar9[uVar7].mb_type != uVar1;
            if (bVar10) break;
            local_48 = local_48 + 1;
            iVar2 = infer_skip(str,slice,phVar9 + uVar7);
            if (iVar2 != 0) goto LAB_00107509;
            uVar8 = slice->curr_mb_addr;
            if (uVar8 == slice->last_mb_in_slice) break;
            slice->prev_mb_addr = uVar8;
            uVar7 = h264_next_mb_addr(slice,uVar8);
            slice->curr_mb_addr = uVar7;
            phVar9 = slice->mbs;
          }
          iVar4 = vs_ue(str,&local_48);
          iVar2 = 8;
          if (iVar4 != 0) {
            iVar2 = 1;
          }
          if (iVar4 == 0 && bVar10) goto LAB_00107221;
        }
        else {
          iVar4 = vs_ue(str,&local_48);
          iVar2 = 1;
          if (iVar4 == 0) {
            while (bVar10 = local_48 != 0, local_48 = local_48 - 1, bVar10) {
              uVar7 = slice->curr_mb_addr;
              if (slice->pic_size_in_mbs <= uVar7) goto LAB_00107504;
              slice->last_mb_in_slice = uVar7;
              phVar9 = slice->mbs;
              phVar9[uVar7].mb_type = uVar1;
              iVar4 = infer_skip(str,slice,phVar9 + uVar7);
              if (iVar4 != 0) goto LAB_0010750f;
              uVar8 = slice->curr_mb_addr;
              slice->prev_mb_addr = uVar8;
              slice->last_mb_in_slice = uVar8;
              uVar8 = h264_next_mb_addr(slice,uVar8);
              slice->curr_mb_addr = uVar8;
            }
            iVar2 = vs_has_more_data(str);
            if (iVar2 == -1) {
              iVar2 = 1;
LAB_001074ad:
              bVar10 = false;
            }
            else {
              if (iVar2 == 0) {
                iVar2 = 8;
                goto LAB_001074ad;
              }
              iVar2 = 0;
              bVar10 = true;
            }
            if (bVar10) goto LAB_00107221;
          }
        }
        goto LAB_0010750f;
      }
LAB_00107221:
      uVar7 = slice->curr_mb_addr;
      if (uVar7 < slice->pic_size_in_mbs) {
        if (slice->mbaff_frame_flag == 0) {
          phVar9 = slice->mbs + uVar7;
          uVar8 = slice->field_pic_flag;
LAB_00107357:
          iVar4 = vs_infer(str,&phVar9->mb_field_decoding_flag,uVar8);
        }
        else {
          uVar3 = uVar7 & 0xfffffffe;
          if (uVar7 != uVar3) {
            if (slice->mbs[uVar3].mb_type == uVar1) {
              iVar4 = h264_mb_field_decoding_flag
                                (str,(h264_cabac_context *)0x0,
                                 &slice->mbs[uVar3].mb_field_decoding_flag);
              iVar2 = 1;
              if (iVar4 != 0) goto LAB_0010750f;
            }
            phVar9 = slice->mbs + (uVar7 | 1);
            uVar8 = slice->mbs[uVar3].mb_field_decoding_flag;
            goto LAB_00107357;
          }
          iVar4 = h264_mb_field_decoding_flag
                            (str,(h264_cabac_context *)0x0,&slice->mbs[uVar3].mb_field_decoding_flag
                            );
        }
        iVar2 = 1;
        if (iVar4 == 0) {
          iVar4 = h264_macroblock_layer
                            (str,(h264_cabac_context *)0x0,slice,slice->mbs + slice->curr_mb_addr);
          iVar2 = 1;
          if (iVar4 == 0) {
            if (str->dir == VS_ENCODE) {
              iVar2 = 8;
              if (slice->last_mb_in_slice == slice->curr_mb_addr) goto LAB_0010750f;
            }
            else {
              slice->last_mb_in_slice = slice->curr_mb_addr;
              iVar2 = vs_has_more_data(str);
              if (iVar2 == -1) {
                iVar2 = 1;
LAB_001074c6:
                bVar10 = false;
              }
              else {
                if (iVar2 == 0) {
                  iVar2 = 8;
                  goto LAB_001074c6;
                }
                iVar2 = 0;
                bVar10 = true;
              }
              if (!bVar10) goto LAB_0010750f;
            }
            uVar8 = slice->curr_mb_addr;
            slice->prev_mb_addr = uVar8;
            if (str->dir == VS_DECODE) {
              slice->last_mb_in_slice = uVar8;
            }
            uVar8 = h264_next_mb_addr(slice,uVar8);
            slice->curr_mb_addr = uVar8;
            iVar2 = 0;
            if (slice->pic_size_in_mbs <= uVar8) goto LAB_00107504;
          }
        }
      }
      else {
LAB_00107504:
        h264_slice_data_cold_2();
LAB_00107509:
        iVar2 = 1;
      }
LAB_0010750f:
    } while (iVar2 == 0);
    if (iVar2 == 8) {
      iVar2 = vs_end(str);
      uVar7 = (uint)(iVar2 != 0);
    }
    else {
      uVar7 = 1;
    }
  }
  else {
    uVar3 = 1;
    uVar7 = 1;
    iVar2 = vs_align_byte(str,VS_ALIGN_1);
    if (iVar2 == 0) {
      cabac = h264_cabac_new(slice);
      iVar2 = h264_cabac_init_arith(str,cabac);
      local_40 = cabac;
      if (iVar2 == 0) {
        do {
          local_44 = 0;
          uVar7 = uVar3;
          if ((slice->slice_type == 2) || (slice->slice_type == 4)) {
LAB_0010762e:
            if (local_44 == 0) {
              if (slice->mbaff_frame_flag != 0) {
                uVar3 = slice->curr_mb_addr;
                uVar6 = uVar3 & 0xfffffffe;
                if (uVar3 == uVar6) {
                  iVar2 = h264_mb_field_decoding_flag
                                    (str,local_40,&slice->mbs[uVar6].mb_field_decoding_flag);
LAB_00107704:
                  if (iVar2 != 0) goto LAB_00107708;
                  bVar10 = true;
                  cabac = local_40;
                }
                else {
                  if ((slice->mbs[uVar6].mb_type != uVar1) ||
                     (iVar2 = h264_mb_field_decoding_flag
                                        (str,local_40,&slice->mbs[uVar6].mb_field_decoding_flag),
                     iVar2 == 0)) {
                    iVar2 = vs_infer(str,&slice->mbs[(ulong)uVar3 | 1].mb_field_decoding_flag,
                                     slice->mbs[uVar6].mb_field_decoding_flag);
                    goto LAB_00107704;
                  }
LAB_00107708:
                  cabac = local_40;
                  h264_cabac_destroy(local_40);
                  uVar7 = 1;
                  bVar10 = false;
                }
                if (!bVar10) goto LAB_0010775c;
LAB_00107729:
                iVar2 = h264_macroblock_layer(str,cabac,slice,slice->mbs + slice->curr_mb_addr);
                goto LAB_0010774b;
              }
              iVar2 = vs_infer(str,&slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag,
                               slice->field_pic_flag);
              if (iVar2 == 0) goto LAB_00107729;
LAB_0010774f:
              h264_cabac_destroy(cabac);
LAB_00107757:
              uVar7 = 1;
              goto LAB_0010775c;
            }
            iVar2 = infer_skip(str,slice,slice->mbs + slice->curr_mb_addr);
LAB_0010774b:
            if (iVar2 != 0) goto LAB_0010774f;
            if ((slice->mbaff_frame_flag != 0) && ((slice->curr_mb_addr & 1) == 0)) {
LAB_001077ec:
              uVar8 = slice->curr_mb_addr;
              slice->prev_mb_addr = uVar8;
              if (str->dir == VS_DECODE) {
                slice->last_mb_in_slice = uVar8;
              }
              uVar8 = h264_next_mb_addr(slice,uVar8);
              slice->curr_mb_addr = uVar8;
              bVar10 = true;
              if (uVar8 < slice->pic_size_in_mbs) goto LAB_0010775e;
              h264_slice_data_cold_1();
              goto LAB_00107757;
            }
            local_38 = (uint)(slice->last_mb_in_slice == slice->curr_mb_addr);
            iVar2 = h264_cabac_terminate(str,cabac,&local_38);
            if (iVar2 == 0) {
              if (local_38 == 0) {
                bVar10 = true;
              }
              else {
                slice->last_mb_in_slice = slice->curr_mb_addr;
                h264_cabac_destroy(cabac);
                bVar10 = false;
                uVar7 = vs_align_byte(str,VS_ALIGN_0);
              }
            }
            else {
              h264_cabac_destroy(cabac);
              uVar7 = 1;
              bVar10 = false;
            }
            if (bVar10) goto LAB_001077ec;
            bVar10 = false;
          }
          else {
            if (str->dir == VS_ENCODE) {
              local_44 = (uint32_t)(slice->mbs[slice->curr_mb_addr].mb_type == uVar1);
            }
            phVar9 = slice->mbs;
            uVar7 = slice->curr_mb_addr;
            uVar8 = phVar9[uVar7].mb_field_decoding_flag;
            local_34 = uVar3;
            if ((((uVar7 & 1) == 0) || (slice->mbaff_frame_flag == 0)) ||
               (phVar9[uVar7 - 1].mb_type == uVar1)) {
              uVar5 = inferred_mb_field_decoding_flag(slice);
            }
            else {
              uVar5 = phVar9[uVar7 - 1].mb_field_decoding_flag;
            }
            cabac = local_40;
            phVar9[uVar7].mb_field_decoding_flag = uVar5;
            iVar2 = h264_mb_skip_flag(str,local_40,&local_44);
            if (iVar2 == 0) {
              slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = uVar8;
              uVar7 = local_34;
              goto LAB_0010762e;
            }
            h264_cabac_destroy(cabac);
            uVar7 = 1;
LAB_0010775c:
            bVar10 = false;
          }
LAB_0010775e:
          uVar3 = uVar7;
        } while (bVar10);
      }
      else {
        h264_cabac_destroy(cabac);
      }
    }
  }
  return uVar7;
}

Assistant:

int h264_slice_data(struct bitstream *str, struct h264_slice *slice) {
	slice->prev_mb_addr = -1;
	slice->curr_mb_addr = slice->first_mb_in_slice * (1 + slice->mbaff_frame_flag);
	if (str->dir == VS_DECODE)
		slice->last_mb_in_slice = slice->curr_mb_addr;
	uint32_t skip_type = (slice->slice_type == H264_SLICE_TYPE_B ? H264_MB_TYPE_B_SKIP : H264_MB_TYPE_P_SKIP);
	if (slice->picparm->entropy_coding_mode_flag) {
		if (vs_align_byte(str, VS_ALIGN_1)) return 1;
		struct h264_cabac_context *cabac = h264_cabac_new(slice);
		if (h264_cabac_init_arith(str, cabac)) { h264_cabac_destroy(cabac); return 1; }
		while (1) {
			uint32_t mb_skip_flag = 0;
			if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
				if (str->dir == VS_ENCODE) {
					mb_skip_flag = slice->mbs[slice->curr_mb_addr].mb_type == skip_type;
				}
				/* mb_field_decoding_flag is decoded *after* mb_skip_flag in some circumstances, have to use an inferred value for CABAC prediction */
				int save = slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag;
				int ival;
				if (slice->mbaff_frame_flag
						&& slice->curr_mb_addr & 1
						&& slice->mbs[slice->curr_mb_addr - 1].mb_type != skip_type) {
					ival = slice->mbs[slice->curr_mb_addr - 1].mb_field_decoding_flag;
				} else {
					ival = inferred_mb_field_decoding_flag(slice);
				}
				slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = ival;
				if (h264_mb_skip_flag(str, cabac, &mb_skip_flag)) { h264_cabac_destroy(cabac); return 1; }
				slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = save;
			}
			if (mb_skip_flag) {
				if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) { h264_cabac_destroy(cabac); return 1; }
			} else {
				if (slice->mbaff_frame_flag) {
					uint32_t first_addr = slice->curr_mb_addr & ~1;
					if (slice->curr_mb_addr == first_addr) {
						if (h264_mb_field_decoding_flag(str, cabac, &slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
					} else {
						if (slice->mbs[first_addr].mb_type == skip_type) {
							if (h264_mb_field_decoding_flag(str, cabac, &slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
						}
						if (vs_infer(str, &slice->mbs[first_addr + 1].mb_field_decoding_flag, slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
					}
				} else {
					if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) { h264_cabac_destroy(cabac); return 1; }
				}
				if (h264_macroblock_layer(str, cabac, slice, &slice->mbs[slice->curr_mb_addr])) { h264_cabac_destroy(cabac); return 1; }
			}
			if (!slice->mbaff_frame_flag || (slice->curr_mb_addr & 1)) {
				uint32_t end_of_slice_flag = slice->last_mb_in_slice == slice->curr_mb_addr;
				if (h264_cabac_terminate(str, cabac, &end_of_slice_flag)) { h264_cabac_destroy(cabac); return 1; }
				if (end_of_slice_flag) {
					slice->last_mb_in_slice = slice->curr_mb_addr;
					h264_cabac_destroy(cabac);
					/* XXX: cabac_zero_word crap */
					return vs_align_byte(str, VS_ALIGN_0);
				}
			}
			slice->prev_mb_addr = slice->curr_mb_addr;
			if (str->dir == VS_DECODE)
				slice->last_mb_in_slice = slice->curr_mb_addr;
			slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
		}
	} else {
		while (1) {
			int end = 0;
			uint32_t mb_skip_run = 0;
			if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
				if (str->dir == VS_ENCODE) {
					mb_skip_run = 0;
					while (slice->mbs[slice->curr_mb_addr].mb_type == skip_type) {
						mb_skip_run++;
						if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
						if (slice->curr_mb_addr == slice->last_mb_in_slice) {
							end = 1;
							break;
						}
						slice->prev_mb_addr = slice->curr_mb_addr;
						slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
					}
					if (vs_ue(str, &mb_skip_run)) return 1;
					if (end)
						goto out_cavlc;
				} else {
					if (vs_ue(str, &mb_skip_run)) return 1;
					while (mb_skip_run--) {
						if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
							fprintf(stderr, "MB index out of range!\n");
							return 1;
						}
						slice->last_mb_in_slice = slice->curr_mb_addr;
						slice->mbs[slice->curr_mb_addr].mb_type = skip_type;
						if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
						slice->prev_mb_addr = slice->curr_mb_addr;
						slice->last_mb_in_slice = slice->curr_mb_addr;
						slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
					}
					int more = vs_has_more_data(str);
					if (more == -1)
						return 1;
					if (more == 0)
						goto out_cavlc;
				}
			}
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
			if (slice->mbaff_frame_flag) {
				uint32_t first_addr = slice->curr_mb_addr & ~1;
				if (slice->curr_mb_addr == first_addr) {
					if (h264_mb_field_decoding_flag(str, 0, &slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
				} else {
					if (slice->mbs[first_addr].mb_type == skip_type)
						if (h264_mb_field_decoding_flag(str, 0, &slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
					if (vs_infer(str, &slice->mbs[first_addr + 1].mb_field_decoding_flag, slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
				}
			} else {
				if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) return 1;
			}
			if (h264_macroblock_layer(str, 0, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
			if(str->dir == VS_ENCODE) {
				if (slice->last_mb_in_slice == slice->curr_mb_addr)
					goto out_cavlc;
			} else {
				slice->last_mb_in_slice = slice->curr_mb_addr;
				int more = vs_has_more_data(str);
				if (more == -1)
					return 1;
				if (more == 0)
					goto out_cavlc;
			}
			slice->prev_mb_addr = slice->curr_mb_addr;
			if (str->dir == VS_DECODE)
				slice->last_mb_in_slice = slice->curr_mb_addr;
			slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
		}
out_cavlc:
		if (vs_end(str)) return 1;
		return 0;
	}
}